

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

void __thiscall icu_63::TimeZoneFormat::~TimeZoneFormat(TimeZoneFormat *this)

{
  UnicodeString *local_48;
  int local_14;
  int32_t i;
  TimeZoneFormat *this_local;
  
  (this->super_Format).super_UObject._vptr_UObject = (_func_int **)&PTR__TimeZoneFormat_004ee698;
  if (this->fTimeZoneNames != (TimeZoneNames *)0x0) {
    (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[1])();
  }
  if (this->fTimeZoneGenericNames != (TimeZoneGenericNames *)0x0) {
    (*this->fTimeZoneGenericNames->_vptr_TimeZoneGenericNames[1])();
  }
  if (this->fTZDBTimeZoneNames != (TZDBTimeZoneNames *)0x0) {
    (*(this->fTZDBTimeZoneNames->super_TimeZoneNames).super_UObject._vptr_UObject[1])();
  }
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    if (this->fGMTOffsetPatternItems[local_14] != (UVector *)0x0) {
      (*(this->fGMTOffsetPatternItems[local_14]->super_UObject)._vptr_UObject[1])();
    }
  }
  UnicodeString::~UnicodeString(&this->fGMTPatternSuffix);
  UnicodeString::~UnicodeString(&this->fGMTPatternPrefix);
  UnicodeString::~UnicodeString(&this->fGMTZeroFormat);
  local_48 = (UnicodeString *)this->fGMTOffsetDigits;
  do {
    local_48 = local_48 + -1;
    UnicodeString::~UnicodeString(local_48);
  } while (local_48 != (UnicodeString *)&this->field_0x280);
  UnicodeString::~UnicodeString(&this->fGMTPattern);
  Locale::~Locale(&this->fLocale);
  Format::~Format(&this->super_Format);
  return;
}

Assistant:

TimeZoneFormat::~TimeZoneFormat() {
    delete fTimeZoneNames;
    delete fTimeZoneGenericNames;
    delete fTZDBTimeZoneNames;
    for (int32_t i = 0; i < UTZFMT_PAT_COUNT; i++) {
        delete fGMTOffsetPatternItems[i];
    }
}